

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

boolean dig_corridor(level *lev,coord *org,coord *dest,boolean nxcor,schar ftyp,schar btyp)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  schar *psVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  schar *psVar15;
  bool bVar16;
  uint uVar17;
  uint x;
  ulong uVar18;
  char cVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  bool bVar24;
  uint uVar25;
  uint y;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  
  cVar19 = org->x;
  cVar1 = org->y;
  cVar2 = dest->x;
  cVar3 = dest->y;
  uVar5 = 0;
  if ('\x14' < cVar3 ||
      (('\x14' < cVar1 || ('O' < cVar2 || 0x4f < cVar19)) ||
      ((cVar3 < '\x01' || cVar2 < '\x01') || (cVar1 < '\x01' || cVar19 < '\x01')))) {
LAB_0024bf91:
    return (boolean)uVar5;
  }
  uVar29 = (uint)cVar3;
  uVar7 = 1;
  if (cVar2 <= cVar19) {
    uVar7 = 0;
    if (cVar1 < cVar3) {
      uVar5 = 1;
    }
    else {
      uVar5 = -(uint)(cVar19 <= cVar2);
      uVar7 = -(uint)(cVar2 < cVar19);
    }
  }
  uVar6 = (uint)cVar2;
  uVar18 = (ulong)((int)cVar19 - uVar7);
  uVar26 = (ulong)((int)cVar1 - uVar5);
  uVar10 = 0;
LAB_0024b8b2:
  do {
    uVar25 = uVar5;
    uVar20 = 0x1f5;
    if (0x1f5 < (int)uVar10) {
      uVar20 = uVar10;
    }
    uVar5 = (int)uVar26 + uVar25 * 2;
    uVar12 = uVar10 + 1;
    iVar21 = uVar25 + 1 + (int)uVar26;
    do {
      iVar28 = iVar21;
      uVar10 = uVar12;
      uVar11 = uVar7;
      uVar22 = uVar5;
      uVar17 = (uint)uVar18;
      uVar27 = (uint)uVar26;
      if ((uVar17 == uVar6) && (uVar29 == uVar27)) {
        uVar5 = 1;
        goto LAB_0024bf91;
      }
      if (uVar10 - uVar20 == 1) {
        if (nxcor == '\0') {
          warning("dig_corridor: giving up after %d tries",(ulong)uVar20);
        }
LAB_0024bf8e:
        uVar5 = 0;
        goto LAB_0024bf91;
      }
      if ((nxcor != '\0') && (uVar5 = mt_random(), uVar5 * -0x75075075 < 0x7507508))
      goto LAB_0024bf8e;
      x = uVar17 + uVar11;
      uVar18 = (ulong)x;
      if (((uVar17 + uVar11) - 0x4f < 0xffffffb2) || ((uVar25 - 0x14) + uVar27 < 0xffffffed)) {
        if (nxcor == '\0') {
          pcVar9 = "dig_corridor: hit level edge [%d,%d]";
LAB_0024bf87:
          warning(pcVar9,(ulong)x,(ulong)(uVar25 + uVar27));
        }
        goto LAB_0024bf8e;
      }
      y = uVar25 + uVar27;
      uVar26 = (ulong)y;
      cVar19 = lev->locations[uVar18][uVar26].typ;
      if (cVar19 == btyp) {
        psVar8 = &lev->locations[uVar18][uVar26].typ;
        if ((ftyp == '\x18') &&
           (uVar5 = mt_random(), (uVar5 * -0x3d70a3d7 >> 2 | uVar5 * 0x40000000) < 0x28f5c29)) {
          *psVar8 = '\x18';
        }
        else {
          *psVar8 = ftyp;
          if ((nxcor != '\0') &&
             (uVar5 = mt_random(),
             (uVar5 * -0x3d70a3d7 >> 1 | (uint)((uVar5 * -0x3d70a3d7 & 1) != 0) << 0x1f) < 0x51eb852
             )) {
            mksobj_at(0x214,lev,x,y,'\x01','\0');
          }
        }
      }
      else if (cVar19 != '\x10' && cVar19 != ftyp) {
        if (nxcor == '\0') {
          pcVar9 = "dig_corridor: trying to dig disallowed tile [%d,%d]";
          goto LAB_0024bf87;
        }
        goto LAB_0024bf8e;
      }
      uVar7 = x - uVar6;
      uVar5 = -uVar7;
      if (0 < (int)uVar7) {
        uVar5 = uVar7;
      }
      uVar12 = (uVar25 - uVar29) + uVar27;
      uVar7 = -uVar12;
      if (0 < (int)uVar12) {
        uVar7 = uVar12;
      }
      if (uVar25 == 0) {
LAB_0024bae3:
        if (uVar11 == 0) {
          uVar13 = 0;
        }
        else if (((uVar5 < uVar7) || (((int)uVar11 < 0 && ((int)x < (int)uVar6)))) ||
                ((uVar13 = uVar11, 0 < (int)uVar11 && (uVar13 = 1, (int)uVar6 < (int)x)))) {
          uVar5 = (uint)((int)y <= (int)uVar29) * 2 - 1;
          cVar19 = lev->locations[uVar18][uVar25 + (uint)((int)y <= (int)uVar29) * 2 + -1 + uVar27].
                   typ;
          uVar7 = 0;
          if ((cVar19 != '\x10') && (cVar19 != btyp)) goto LAB_0024bba4;
          goto LAB_0024b8b2;
        }
      }
      else {
        if (((uVar5 <= uVar7) && (-1 < (int)uVar25 || (int)uVar29 <= (int)y)) &&
           ((int)uVar25 < 1 || (int)y <= (int)uVar29)) goto LAB_0024bae3;
        uVar7 = (uint)((int)x <= (int)uVar6) * 2 - 1;
        cVar19 = lev->locations[(x + (uint)((int)x <= (int)uVar6) * 2) - 1][uVar26].typ;
        uVar5 = 0;
        if ((cVar19 == '\x10') || (cVar19 == btyp)) goto LAB_0024b8b2;
LAB_0024bba4:
        uVar13 = uVar11;
        if (cVar19 == ftyp) goto LAB_0024b8b2;
      }
      uVar12 = uVar10 + 1;
      cVar19 = lev->locations[uVar13 + x][uVar27 + uVar25 * 2].typ;
      iVar21 = uVar25 + iVar28;
      uVar5 = uVar22 + uVar25;
      uVar7 = uVar13;
    } while (((cVar19 == '\x10') || (cVar19 == btyp)) || (cVar19 == ftyp));
    if (uVar13 == 0) {
      if (uVar29 == y) {
        bVar24 = (int)uVar6 < (int)x;
        bVar16 = (int)x <= (int)uVar6;
      }
      else {
        psVar8 = &lev->locations[uVar18 + 1][uVar22].typ;
        iVar21 = uVar17 + uVar11;
        pcVar9 = (char *)((long)lev + uVar18 * 0xfc + (ulong)uVar22 * 0xc + -0xb8);
        lVar23 = 0x4e;
        bVar16 = false;
        bVar24 = false;
        do {
          iVar21 = iVar21 + 1;
          if ((bVar24) && (bVar16)) break;
          if ((lVar23 + uVar18 != 0x4f && -1 < (long)(lVar23 + uVar18 + -0x4f)) &&
             (bVar4 = !bVar24, bVar24 = true, bVar4)) {
            if (lVar23 + uVar18 == 0x50) {
              bVar24 = false;
            }
            else {
              cVar19 = *pcVar9;
              bVar24 = cVar19 == '\x10' || (cVar19 == ftyp || cVar19 == btyp);
            }
          }
          if ((iVar21 < 0x4f) && (bVar4 = !bVar16, bVar16 = true, bVar4)) {
            if ((0x4d - uVar18) + lVar23 == 0x4e) {
              bVar16 = false;
            }
            else {
              cVar19 = *psVar8;
              bVar16 = cVar19 == '\x10' || (cVar19 == ftyp || cVar19 == btyp);
            }
          }
          psVar8 = psVar8 + 0xfc;
          pcVar9 = pcVar9 + -0xfc;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      if (((nxcor == '\0') && (!bVar24)) && (!bVar16)) {
        warning("dig_corridor: vertical corridor blocked");
      }
      uVar7 = -(uint)(byte)(~bVar16 | (int)uVar6 < (int)x & bVar24) | 1;
      uVar5 = 0;
    }
    else {
      if (x == uVar6) {
        bVar24 = (int)uVar29 < (int)y;
        bVar16 = (int)y <= (int)uVar29;
      }
      else {
        uVar14 = (ulong)(uVar13 + uVar11 + uVar17);
        psVar15 = &lev->locations[uVar14][uVar26 + 1].typ;
        psVar8 = &lev->locations[uVar14 - 1][uVar26 + 0x14].typ;
        lVar23 = 0x13;
        bVar16 = false;
        bVar24 = false;
        do {
          if ((bVar24) && (bVar16)) break;
          if ((lVar23 + uVar26 != 0x14 && -1 < (long)(lVar23 + uVar26 + -0x14)) &&
             (bVar4 = !bVar24, bVar24 = true, bVar4)) {
            if ((uVar26 - 0x12) + lVar23 == 3) {
              bVar24 = false;
            }
            else {
              cVar19 = *psVar8;
              bVar24 = cVar19 == '\x10' || (cVar19 == ftyp || cVar19 == btyp);
            }
          }
          if ((iVar28 < 0x14) && (bVar4 = !bVar16, bVar16 = true, bVar4)) {
            if ((0x12 - uVar26) + lVar23 == 0x13) {
              bVar16 = false;
            }
            else {
              cVar19 = *psVar15;
              bVar16 = cVar19 == '\x10' || (cVar19 == ftyp || cVar19 == btyp);
            }
          }
          psVar15 = psVar15 + 0xc;
          iVar28 = iVar28 + 1;
          psVar8 = psVar8 + -0xc;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      if (((nxcor == '\0') && (!bVar24)) && (!bVar16)) {
        warning("dig_corridor: horizontal corridor blocked");
      }
      uVar5 = -(uint)(byte)(~bVar16 | (int)uVar29 < (int)y & bVar24) | 1;
      uVar7 = 0;
    }
    cVar19 = lev->locations[uVar7 + x][uVar5 + y].typ;
    if (((cVar19 != '\x10') && (cVar19 != btyp)) && (cVar19 != ftyp)) {
      uVar7 = -uVar7;
      uVar5 = -uVar5;
    }
  } while( true );
}

Assistant:

boolean dig_corridor(struct level *lev, coord *org, coord *dest, boolean nxcor,
		     schar ftyp, schar btyp)
{
	int dx = 0, dy = 0, dix, diy, cct;
	struct rm *crm;
	int tx, ty, xx, yy;

	xx = org->x;
	yy = org->y;
	tx = dest->x;
	ty = dest->y;
	if (xx <= 0 || yy <= 0 || tx <= 0 || ty <= 0 ||
	    xx > COLNO - 1 || tx > COLNO - 1 ||
	    yy > ROWNO - 1 || ty > ROWNO - 1)
	    return FALSE;

	if (tx > xx)		dx = 1;
	else if (ty > yy)	dy = 1;
	else if (tx < xx)	dx = -1;
	else			dy = -1;

	xx -= dx;
	yy -= dy;
	cct = 0;
	while (xx != tx || yy != ty) {
	    /* loop: dig corridor at [xx,yy] and find new [xx,yy] */
	    if (cct++ > 500 || (nxcor && !rn2(35))) {
		if (!nxcor)
		    warning("dig_corridor: giving up after %d tries", cct - 1);
		return FALSE;
	    }

	    xx += dx;
	    yy += dy;

	    if (xx >= COLNO - 1 || xx <= 0 || yy <= 0 || yy >= ROWNO - 1) {
		/* should be impossible */
		if (!nxcor)
		    warning("dig_corridor: hit level edge [%d,%d]", xx, yy);
		return FALSE;
	    }

	    crm = &lev->locations[xx][yy];
	    if (crm->typ == btyp) {
		if (ftyp != CORR || rn2(100)) {
		    crm->typ = ftyp;
		    if (nxcor && !rn2(50))
			mksobj_at(BOULDER, lev, xx, yy, TRUE, FALSE);
		} else {
		    crm->typ = CORR;	/* formerly secret corridor */
		}
	    } else
	    if (crm->typ != ftyp && crm->typ != SCORR) {
		/* strange ... */
		if (!nxcor) {
		    warning("dig_corridor: trying to dig disallowed tile [%d,%d]",
			    xx, yy);
		}
		return FALSE;
	    }

	    /* find next corridor position */
	    dix = abs(xx-tx);
	    diy = abs(yy-ty);

	    /* do we have to change direction ? */
	    if (dy && (dix > diy ||
		       (dy < 0 && yy < ty) ||
		       (dy > 0 && yy > ty))) {
		int ddx = (xx > tx) ? -1 : 1;

		crm = &lev->locations[xx + ddx][yy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dx = ddx;
		    dy = 0;
		    continue;
		}
	    } else if (dx && (diy > dix ||
			      (dx < 0 && xx < tx) ||
			      (dx > 0 && xx > tx))) {
		int ddy = (yy > ty) ? -1 : 1;

		crm = &lev->locations[xx][yy + ddy];
		if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR) {
		    dy = ddy;
		    dx = 0;
		    continue;
		}
	    }

	    /* continue straight on? */
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;

	    /* no, what must we do now?? */
	    if (dx) {
		/* should we go up or down? */
		boolean upok = FALSE;
		boolean downok = FALSE;
		if (xx == tx) {
		    if (yy > ty) upok = TRUE;
		    else downok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < ROWNO - 1; i++) {
			if (upok && downok)
			    break;
			if (yy - i > 0) {
			    crm = &lev->locations[xx + dx][yy - i];
			    if (!upok &&
				yy - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				upok = TRUE;
			}
			if (yy + i < ROWNO - 1) {
			    crm = &lev->locations[xx + dx][yy + i];
			    if (!downok &&
				yy + i + 1 < ROWNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				downok = TRUE;
			}
		    }
		}
		if (!nxcor && !upok && !downok)
		    warning("dig_corridor: horizontal corridor blocked");
		dx = 0;
		dy = ((yy > ty && upok) || !downok) ? -1 : 1;
	    } else {
		/* should we go left or right? */
		boolean leftok = FALSE;
		boolean rightok = FALSE;
		if (yy == ty) {
		    if (xx > tx) leftok = TRUE;
		    else rightok = TRUE;
		} else {
		    /* avoid corners made by rooms near level edges */
		    int i;
		    for (i = 1; i < COLNO - 1; i++) {
			if (leftok && rightok)
			    break;
			if (xx - i > 0) {
			    crm = &lev->locations[xx - i][yy + dy];
			    if (!leftok &&
				xx - i - 1 > 0 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				leftok = TRUE;
			}
			if (xx + i < COLNO - 1) {
			    crm = &lev->locations[xx + i][yy + dy];
			    if (!rightok &&
				xx + i + 1 < COLNO - 1 &&
				(crm->typ == btyp ||
				 crm->typ == ftyp ||
				 crm->typ == SCORR))
				rightok = TRUE;
			}
		    }
		}
		if (!nxcor && !leftok && !rightok)
		    warning("dig_corridor: vertical corridor blocked");
		dx = ((xx > tx && leftok) || !rightok) ? -1 : 1;
		dy = 0;
	    }
	    crm = &lev->locations[xx + dx][yy + dy];
	    if (crm->typ == btyp || crm->typ == ftyp || crm->typ == SCORR)
		continue;
	    dy = -dy;
	    dx = -dx;
	}
	return TRUE;
}